

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aho-corasick-lite.cpp
# Opt level: O1

bool decodeOutString(DAG *_dag,
                    stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *out,Unicode *_unicode)

{
  ushort uVar1;
  uint uVar2;
  pointer puVar3;
  uint uVar4;
  long lVar5;
  char cVar6;
  string temp;
  value_type local_50;
  
  puVar3 = (_unicode->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  uVar4 = (int)((ulong)((long)(_dag->super__Vector_base<DAG_node,_std::allocator<DAG_node>_>).
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(_dag->super__Vector_base<DAG_node,_std::allocator<DAG_node>_>)._M_impl
                             .super__Vector_impl_data._M_start) >> 3) * -0x33333333 - 1;
  while (0 < (int)uVar4) {
    uVar2 = (_dag->super__Vector_base<DAG_node,_std::allocator<DAG_node>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar4].prev;
    if ((int)uVar2 < (int)uVar4) {
      local_50._M_string_length = 0;
      *local_50._M_dataplus._M_p = '\0';
      lVar5 = (long)(int)uVar2 * 2;
      do {
        uVar1 = *(ushort *)((long)puVar3 + lVar5);
        cVar6 = (char)&local_50;
        if (0x7f < uVar1) {
          if (uVar1 < 0x800) {
            std::__cxx11::string::push_back(cVar6);
          }
          else {
            std::__cxx11::string::push_back(cVar6);
            std::__cxx11::string::push_back(cVar6);
          }
        }
        std::__cxx11::string::push_back(cVar6);
        lVar5 = lVar5 + 2;
      } while ((ulong)uVar4 * 2 != lVar5);
    }
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&out->c,&local_50);
    uVar4 = uVar2;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return true;
}

Assistant:

bool decodeOutString(DAG &_dag, stack<string> &out, Unicode _unicode)
{
	int i, j = _dag.size()-1;
	auto begin = _unicode.begin();
	string temp;
	while (j > 0) {
	     i = _dag[j].prev;
	     encode(begin+i, begin+j, temp);
	     j = i;
	     out.push(temp);
	}
    return true;
}